

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putil.cpp
# Opt level: O0

UVoidFunction * uprv_dlsym_func_63(void *lib,char *sym,UErrorCode *status)

{
  UBool UVar1;
  anon_union_8_2_f9ecb2d1 uret;
  UErrorCode *status_local;
  char *sym_local;
  void *lib_local;
  
  UVar1 = U_FAILURE(*status);
  if (UVar1 == '\0') {
    lib_local = (void *)dlsym(lib,sym);
    if (lib_local == (void *)0x0) {
      *status = U_MISSING_RESOURCE_ERROR;
    }
  }
  else {
    lib_local = (void *)0x0;
  }
  return (UVoidFunction *)lib_local;
}

Assistant:

U_INTERNAL UVoidFunction* U_EXPORT2
uprv_dlsym_func(void *lib, const char* sym, UErrorCode *status) {
  union {
      UVoidFunction *fp;
      void *vp;
  } uret;
  uret.fp = NULL;
  if(U_FAILURE(*status)) return uret.fp;
  uret.vp = dlsym(lib, sym);
  if(uret.vp == NULL) {
#ifdef U_TRACE_DYLOAD
    printf("dlerror on dlsym(%p,%s): %s\n", lib,sym, dlerror());
#endif
    *status = U_MISSING_RESOURCE_ERROR;
  }
  return uret.fp;
}